

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

void mbedtls_ssl_reset_in_out_pointers(mbedtls_ssl_context *ssl)

{
  uint8_t uVar1;
  uchar *puVar2;
  long lVar3;
  uchar *puVar4;
  uchar *puVar5;
  long lVar6;
  long lVar7;
  
  puVar5 = ssl->out_buf;
  uVar1 = ssl->conf->transport;
  if (uVar1 == '\x01') {
    ssl->out_hdr = puVar5;
    puVar5 = ssl->in_buf;
  }
  else {
    ssl->out_ctr = puVar5;
    ssl->out_hdr = puVar5 + 8;
    puVar5 = ssl->in_buf + 8;
  }
  puVar2 = ssl->out_hdr;
  puVar4 = puVar2 + 3;
  ssl->in_hdr = puVar5;
  if (uVar1 == '\x01') {
    ssl->out_ctr = puVar4;
    puVar4 = puVar2 + 0xb;
    lVar3 = 0xd;
    lVar7 = 3;
    lVar6 = 0xb;
  }
  else {
    lVar3 = 5;
    lVar7 = -8;
    lVar6 = 3;
  }
  ssl->out_len = puVar4;
  ssl->out_iv = puVar2 + lVar3;
  ssl->out_msg = puVar2 + lVar3;
  puVar5 = ssl->in_hdr;
  ssl->in_ctr = puVar5 + lVar7;
  ssl->in_len = puVar5 + lVar6;
  ssl->in_iv = puVar5 + lVar3;
  ssl->in_msg = puVar5 + lVar3;
  return;
}

Assistant:

void mbedtls_ssl_reset_in_out_pointers(mbedtls_ssl_context *ssl)
{
    /* Set the incoming and outgoing record pointers. */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        ssl->out_hdr = ssl->out_buf;
        ssl->in_hdr  = ssl->in_buf;
    } else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    {
        ssl->out_ctr = ssl->out_buf;
        ssl->out_hdr = ssl->out_buf + 8;
        ssl->in_hdr  = ssl->in_buf  + 8;
    }

    /* Derive other internal pointers. */
    mbedtls_ssl_update_out_pointers(ssl, NULL /* no transform enabled */);
    mbedtls_ssl_update_in_pointers(ssl);
}